

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_hamt_map.cpp
# Opt level: O0

void __thiscall
DefaultIndexFixture_InsertInternalStoreIterator_Test::
DefaultIndexFixture_InsertInternalStoreIterator_Test
          (DefaultIndexFixture_InsertInternalStoreIterator_Test *this)

{
  DefaultIndexFixture_InsertInternalStoreIterator_Test *this_local;
  
  anon_unknown.dwarf_10ddcf::DefaultIndexFixture::DefaultIndexFixture
            (&this->super_DefaultIndexFixture);
  (this->super_DefaultIndexFixture).super_IndexFixture.super_Test._vptr_Test =
       (_func_int **)&PTR__DefaultIndexFixture_InsertInternalStoreIterator_Test_003d04c8;
  return;
}

Assistant:

TEST_F (DefaultIndexFixture, InsertInternalStoreIterator) {
    transaction_type t1 = begin (db_, lock_guard{mutex_});
    index_->insert_or_assign (t1, std::make_pair ("a"s, "b"s));
    index_->insert_or_assign (t1, std::make_pair ("c"s, "d"s));
    index_->flush (t1, db_.get_current_revision ());

    default_index::const_iterator begin = index_->cbegin (db_);
    default_index::const_iterator end = index_->cend (db_);
    EXPECT_NE (begin, end);
    begin++;
    EXPECT_NE (begin, end);
    begin++;
    EXPECT_EQ (begin, end);
}